

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>>
          (RepeatedPtrFieldBase *this,
          Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>_>
          *value)

{
  int iVar1;
  uint uVar2;
  void **ppvVar3;
  ulong uVar4;
  Rep *pRVar5;
  TestAllTypes_NestedMessage *pTVar6;
  ulong uVar7;
  Arena *this_00;
  
  iVar1 = this->current_size_;
  if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
    uVar2 = (uint)(this->tagged_rep_or_elem_ != (void *)0x0);
  }
  else {
    pRVar5 = rep(this);
    uVar2 = pRVar5->allocated_size;
  }
  if (iVar1 < (int)uVar2) {
    iVar1 = this->current_size_;
    this->current_size_ = iVar1 + 1;
    ppvVar3 = element_at(this,iVar1);
    pTVar6 = (TestAllTypes_NestedMessage *)*ppvVar3;
    if (pTVar6 != value) {
      uVar4 = (pTVar6->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if ((uVar4 & 1) != 0) {
        uVar4 = *(ulong *)(uVar4 & 0xfffffffffffffffe);
      }
      uVar7 = (value->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if ((uVar7 & 1) != 0) {
        uVar7 = *(ulong *)(uVar7 & 0xfffffffffffffffe);
      }
      if (uVar4 == uVar7) {
        proto2_unittest::TestAllTypes_NestedMessage::InternalSwap(pTVar6,value);
      }
      else {
        proto2_unittest::TestAllTypes_NestedMessage::CopyFrom(pTVar6,value);
      }
    }
  }
  else {
    MaybeExtend(this);
    if (((ulong)this->tagged_rep_or_elem_ & 1) != 0) {
      pRVar5 = rep(this);
      pRVar5->allocated_size = pRVar5->allocated_size + 1;
    }
    this_00 = this->arena_;
    if (this_00 == (Arena *)0x0) {
      pTVar6 = (TestAllTypes_NestedMessage *)operator_new(0x20);
      this_00 = (Arena *)0x0;
    }
    else {
      pTVar6 = (TestAllTypes_NestedMessage *)Arena::Allocate(this_00,0x20);
    }
    proto2_unittest::TestAllTypes_NestedMessage::TestAllTypes_NestedMessage(pTVar6,this_00,value);
    iVar1 = this->current_size_;
    this->current_size_ = iVar1 + 1;
    ppvVar3 = element_at(this,iVar1);
    *ppvVar3 = pTVar6;
  }
  return;
}

Assistant:

inline void Add(Value<TypeHandler>&& value) {
    static_assert(std::is_move_constructible<Value<TypeHandler>>::value, "");
    static_assert(std::is_move_assignable<Value<TypeHandler>>::value, "");
    if (current_size_ < allocated_size()) {
      *cast<TypeHandler>(element_at(ExchangeCurrentSize(current_size_ + 1))) =
          std::move(value);
      return;
    }
    MaybeExtend();
    if (!using_sso()) ++rep()->allocated_size;
    auto* result = TypeHandler::New(arena_, std::move(value));
    element_at(ExchangeCurrentSize(current_size_ + 1)) = result;
  }